

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * __thiscall
pybind11::cpp_function::dispatcher
          (cpp_function *this,PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  handle hVar5;
  _Bit_pointer puVar6;
  pointer paVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  type_info *find_type;
  undefined8 extraout_RAX;
  undefined8 *puVar11;
  long *plVar12;
  long lVar13;
  function_record *pfVar14;
  function_record *pfVar15;
  object *poVar16;
  error_already_set *this_00;
  instance *piVar17;
  byte bVar18;
  PyObject *tmp;
  ulong uVar19;
  handle hVar20;
  uint __len;
  function_record *pfVar21;
  uint __uval;
  uint uVar22;
  ulong uVar23;
  PyTypeObject *pPVar24;
  handle hVar25;
  bool bVar26;
  handle arg;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  dict kwargs_1;
  function_call call;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  dict kwargs;
  instance *pi;
  value_and_holder self_value_and_holder;
  undefined1 local_1e8 [24];
  object oStack_1d0;
  _Bit_pointer local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  _Bit_pointer local_198;
  function_record *local_188;
  undefined4 local_17c;
  PyTypeObject *local_178;
  handle local_170;
  undefined1 local_168 [8];
  undefined1 auStack_160 [16];
  pointer paStack_150;
  anon_union_24_2_63b86169_for_instance_1 local_148;
  handle hStack_130;
  _Bit_pointer local_128;
  object oStack_120;
  object local_118;
  handle local_110;
  handle local_108;
  ulong local_100;
  undefined1 local_f8 [40];
  handle local_d0;
  long local_c8;
  PyObject local_c0;
  ulong local_b0;
  function_record *local_a8;
  uint local_9c;
  PyTypeObject *local_98;
  value_and_holder *local_90;
  ulong local_88;
  PyTypeObject *local_78;
  PyTypeObject *pPStack_70;
  type_info *local_68;
  pointer paStack_60;
  pointer local_50;
  value_and_holder *local_48;
  
  local_178 = (PyTypeObject *)PyCapsule_GetPointer(this,0);
  if ((self->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                  ,0x1b0,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_b0 = self[1].ob_refcnt;
  if (local_b0 == 0) {
    local_98 = (PyTypeObject *)0x0;
  }
  else {
    local_98 = self[1].ob_type;
  }
  local_68 = (type_info *)0x0;
  paStack_60 = (pointer)0x0;
  local_78 = (PyTypeObject *)0x0;
  pPStack_70 = (PyTypeObject *)0x0;
  local_188 = (function_record *)self;
  if (((ulong)local_178->tp_repr & 0x100) != 0) {
    find_type = detail::get_type_info((PyTypeObject *)local_178->tp_as_sequence);
    self = (PyObject *)local_168;
    detail::instance::get_value_and_holder
              ((value_and_holder *)self,(instance *)local_98,find_type,false);
    local_68 = (type_info *)auStack_160._8_8_;
    paStack_60 = paStack_150;
    local_78 = (PyTypeObject *)local_168;
    pPStack_70 = (PyTypeObject *)auStack_160._0_8_;
    kwargs_in = (PyObject *)local_168;
    if ((type_info *)auStack_160._8_8_ == (type_info *)0x0 || local_168 == (undefined1  [8])0x0) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      bVar26 = false;
      self = (PyObject *)0x0;
    }
    else {
      bVar8 = (byte)((PyObject *)((long)local_168 + 0x30))->ob_refcnt;
      if ((bVar8 & 2) == 0) {
        bVar8 = *(byte *)((long)&(((PyVarObject *)auStack_160._0_8_)->ob_base).ob_refcnt +
                         (long)&(((PyObject *)((long)local_168 + 0x10))->ob_type->ob_base).ob_base.
                                ob_refcnt) & 2;
        kwargs_in = (PyObject *)auStack_160._0_8_;
      }
      else {
        bVar8 = bVar8 >> 3 & 1;
      }
      if (bVar8 == 0) {
        bVar26 = true;
      }
      else {
        self = (PyObject *)&_Py_NoneStruct;
        __Py_NoneStruct = __Py_NoneStruct + 1;
        local_168 = (undefined1  [8])0x0;
        object::~object((object *)local_168);
        bVar26 = false;
      }
    }
    if (!bVar26) {
      return self;
    }
  }
  local_f8._0_8_ = (PyObject *)0x0;
  local_f8._8_8_ = (function_record *)0x0;
  local_f8._16_8_ = (pointer)0x0;
  local_a8 = (function_record *)args_in;
  local_48 = (value_and_holder *)self;
  if (local_178 == (PyTypeObject *)0x0) {
    local_17c = 0;
    hVar25.m_ptr = (PyObject *)0x1;
  }
  else {
    local_17c = (undefined4)
                CONCAT71((int7)((ulong)kwargs_in >> 8),local_178->tp_hash != (hashfunc)0x0);
    local_50 = (pointer)&local_188->args;
    hVar25.m_ptr = (PyObject *)0x1;
    hVar20.m_ptr = (PyObject *)local_178;
    pfVar21 = local_188;
    do {
      bVar8 = *(byte *)((long)&hVar20.m_ptr[5].ob_type + 1);
      bVar18 = (bVar8 & 0x10) >> 4;
      uVar19 = (long)((char)(bVar8 << 2) >> 7) +
               ((ulong)*(ushort *)((long)&hVar20.m_ptr[5].ob_type + 2) - (ulong)bVar18);
      if (((bVar18 == 0) && (uVar19 < local_b0)) ||
         ((local_b0 < uVar19 &&
          ((ulong)(hVar20.m_ptr[2].ob_refcnt - (long)hVar20.m_ptr[1].ob_type >> 5) < uVar19)))) {
        bVar26 = false;
      }
      else {
        local_148.simple_value_holder[2] = (function_record *)0x0;
        hStack_130.m_ptr = hStack_130.m_ptr & 0xffffffff00000000;
        local_148.simple_value_holder[1] =
             (void *)((ulong)local_148.simple_value_holder[1] & 0xffffffff00000000);
        paStack_150 = (pointer)0x0;
        local_148.simple_value_holder[0] = (function_record *)0x0;
        auStack_160._0_8_ = (PyTypeObject *)0x0;
        auStack_160._8_8_ = (type_info *)0x0;
        local_118.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_128 = (_Bit_pointer)0x0;
        oStack_120.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_110.m_ptr = (PyObject *)local_98;
        local_108.m_ptr = (PyObject *)0x0;
        local_168 = (undefined1  [8])hVar20.m_ptr;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_160,
                   (ulong)*(ushort *)((long)&hVar20.m_ptr[5].ob_type + 2));
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                   (ulong)*(ushort *)((long)&hVar20.m_ptr[5].ob_type + 2));
        local_88 = uVar19;
        if (local_b0 < uVar19) {
          local_88 = local_b0;
        }
        if (((ulong)hVar20.m_ptr[5].ob_type & 0x200) == 0) {
          uVar23 = 0;
        }
        else {
          if ((PyObject *)paStack_60->name != (PyObject *)0x0) {
            (*local_68->dealloc)((value_and_holder *)&stack0xffffffffffffff88);
          }
          if ((((PyTypeObject *)
               (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&pfVar21->doc)->
               super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
               super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_in)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                          ,0x1fc,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          local_108.m_ptr =
               *(PyObject **)
                &(pfVar21->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data;
          local_1e8._0_8_ = &stack0xffffffffffffff88;
          if ((pointer)auStack_160._8_8_ == paStack_150) {
            std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::
            _M_realloc_insert<pybind11::handle>
                      ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_160,
                       (iterator)auStack_160._8_8_,(handle *)local_1e8);
          }
          else {
            *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1e8._0_8_;
            auStack_160._8_8_ = auStack_160._8_8_ + 8;
          }
          uVar23 = 1;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
        }
        local_100 = uVar19;
        local_90 = (value_and_holder *)hVar25.m_ptr;
        if (uVar23 < local_88) {
          uVar19 = (ulong)(uint)((int)uVar23 << 5);
          bVar26 = false;
          do {
            plVar12 = (long *)((long)&((hVar20.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt +
                              uVar19);
            if ((ulong)(hVar20.m_ptr[2].ob_refcnt - (long)hVar20.m_ptr[1].ob_type >> 5) <= uVar23) {
              plVar12 = (long *)0x0;
            }
            if ((((local_a8 == (function_record *)0x0) || (plVar12 == (long *)0x0)) ||
                (*plVar12 == 0)) || (lVar13 = PyDict_GetItemString(local_a8), lVar13 == 0)) {
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_188->doc)
                   ->super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                   _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                              ,0x20b,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1e8._0_8_ = local_188->data[uVar23 - 4];
              if (((plVar12 == (long *)0x0) || ((*(byte *)(plVar12 + 3) & 2) != 0)) ||
                 ((function_record *)local_1e8._0_8_ != (function_record *)&_Py_NoneStruct)) {
                if ((pointer)auStack_160._8_8_ == paStack_150) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_160,(iterator)auStack_160._8_8_,(handle *)local_1e8);
                }
                else {
                  *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1e8._0_8_;
                  auStack_160._8_8_ = auStack_160._8_8_ + 8;
                }
                bVar1 = true;
                bVar8 = 1;
                if (plVar12 != (long *)0x0) {
                  bVar8 = *(byte *)(plVar12 + 3);
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                           (bool)(bVar8 & 1));
              }
              else {
                bVar1 = false;
                bVar26 = true;
              }
            }
            else {
              bVar26 = true;
              bVar1 = false;
            }
            pfVar21 = local_188;
            if (!bVar1) break;
            uVar23 = uVar23 + 1;
            uVar19 = uVar19 + 0x20;
          } while (local_88 != uVar23);
        }
        else {
          bVar26 = false;
        }
        if (bVar26) {
          bVar26 = false;
          hVar25.m_ptr = (PyObject *)local_90;
        }
        else {
          local_d0.m_ptr = (PyObject *)local_a8;
          if (local_a8 != (function_record *)0x0) {
            local_a8->name = (char *)((long)&((function_record *)local_a8->name)->name + 1);
          }
          if (uVar23 < local_100) {
            lVar13 = uVar23 << 5;
            bVar26 = true;
            local_9c = 0;
            do {
              pPVar24 = hVar20.m_ptr[1].ob_type;
              local_1e8._0_8_ = (function_record *)0x0;
              if ((local_a8 != (function_record *)0x0) &&
                 (*(long *)((long)&(pPVar24->ob_base).ob_base.ob_refcnt + lVar13) != 0)) {
                local_1e8._0_8_ = PyDict_GetItemString(local_d0.m_ptr);
              }
              if ((function_record *)local_1e8._0_8_ == (function_record *)0x0) {
                if (*(long *)((long)&(pPVar24->ob_base).ob_size + lVar13) != 0) {
                  local_1e8._0_8_ = *(undefined8 *)((long)&(pPVar24->ob_base).ob_size + lVar13);
                }
              }
              else {
                if ((local_9c & 1) == 0) {
                  local_1b8._0_8_ = PyDict_Copy(local_d0.m_ptr);
                  object::operator=((object *)&local_d0,(object *)local_1b8);
                  object::~object((object *)local_1b8);
                  local_9c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                PyDict_DelItemString(local_d0.m_ptr);
              }
              uVar2 = local_1e8._0_8_;
              if ((function_record *)local_1e8._0_8_ == (function_record *)0x0) {
LAB_0010dccc:
                if (bVar26) {
                  bVar26 = false;
                  pfVar21 = local_188;
                  hVar25.m_ptr = (PyObject *)local_90;
                  goto LAB_0010e16e;
                }
                break;
              }
              if ((pointer)auStack_160._8_8_ == paStack_150) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                           (iterator)auStack_160._8_8_,(handle *)local_1e8);
              }
              else {
                *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1e8._0_8_;
                auStack_160._8_8_ = auStack_160._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                         (bool)(*(byte *)((long)&pPVar24->tp_name + lVar13) & 1));
              if ((function_record *)uVar2 == (function_record *)0x0) goto LAB_0010dccc;
              uVar23 = uVar23 + 1;
              lVar13 = lVar13 + 0x20;
              bVar26 = uVar23 < local_100;
            } while (bVar26);
          }
          hVar25.m_ptr = (PyObject *)local_90;
          pfVar21 = local_188;
          if ((((function_record *)local_d0.m_ptr == (function_record *)0x0) ||
              (lVar13 = PyDict_Size(), lVar13 == 0)) ||
             (((ulong)hVar20.m_ptr[5].ob_type & 0x2000) != 0)) {
            if (((ulong)hVar20.m_ptr[5].ob_type & 0x1000) != 0) {
              tuple::tuple((tuple *)local_1b8,0);
              if (local_88 == 0) {
                local_1e8._0_8_ = pfVar21;
                if (pfVar21 != (function_record *)0x0) {
                  pfVar21->name = (char *)((long)&((function_record *)pfVar21->name)->name + 1);
                }
LAB_0010ddf5:
                object::operator=((object *)local_1b8,(object *)local_1e8);
                object::~object((object *)local_1e8);
              }
              else {
                pfVar21 = (function_record *)(local_b0 - uVar23);
                if (local_b0 < uVar23 || pfVar21 == (function_record *)0x0) {
                  tuple::tuple((tuple *)local_1e8,0);
                  goto LAB_0010ddf5;
                }
                tuple::tuple((tuple *)local_1e8,(size_t)pfVar21);
                object::operator=((object *)local_1b8,(object *)local_1e8);
                object::~object((object *)local_1e8);
                paVar7 = local_50;
                if (local_b0 != uVar23) {
                  pfVar14 = (function_record *)0x0;
                  do {
                    if ((((PyTypeObject *)
                         (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          &local_188->doc)->
                         super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                         _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                      __assert_fail("PyTuple_Check(args_in)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/ext/pybind11/include/pybind11/pybind11.h"
                                    ,0x24c,
                                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                   );
                    }
                    local_1e8._8_8_ = local_1b8._0_8_;
                    oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0x0;
                    local_1e8._16_8_ = pfVar14;
                    detail::accessor_policies::tuple_item::set
                              ((handle)local_1b8._0_8_,(size_t)pfVar14,
                               *(PyObject **)
                                ((long)&paVar7->name + ((long)pfVar14->data + (uVar23 - 0x38)) * 8))
                    ;
                    object::~object((object *)(local_1e8 + 0x18));
                    pfVar14 = (function_record *)((long)&pfVar14->name + 1);
                  } while (pfVar21 != pfVar14);
                }
              }
              if ((pointer)auStack_160._8_8_ == paStack_150) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                           (iterator)auStack_160._8_8_,(handle *)local_1b8);
              }
              else {
                *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1b8._0_8_;
                auStack_160._8_8_ = auStack_160._8_8_ + 8;
              }
              pfVar21 = local_188;
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
              object::operator=(&oStack_120,(object *)local_1b8);
              object::~object((object *)local_1b8);
            }
            if (((ulong)hVar20.m_ptr[5].ob_type & 0x2000) != 0) {
              if ((function_record *)local_d0.m_ptr == (function_record *)0x0) {
                dict::dict((dict *)local_1e8);
                object::operator=((object *)&local_d0,(object *)local_1e8);
                object::~object((object *)local_1e8);
              }
              if ((pointer)auStack_160._8_8_ == paStack_150) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                           (iterator)auStack_160._8_8_,&local_d0);
              }
              else {
                *(PyObject **)auStack_160._8_8_ = local_d0.m_ptr;
                auStack_160._8_8_ = auStack_160._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
              object::operator=(&local_118,(object *)&local_d0);
            }
            uVar19 = (ulong)*(ushort *)((long)&hVar20.m_ptr[5].ob_type + 2);
            if (((long)(auStack_160._8_8_ - auStack_160._0_8_) >> 3 != uVar19) ||
               (((ulong)hStack_130.m_ptr & 0xffffffff) +
                ((long)local_148.simple_value_holder[2] - local_148._0_8_) * 8 != uVar19)) {
              pybind11_fail(
                           "Internal error: function call dispatcher inserted wrong number of arguments!"
                           );
            }
            local_1b8._0_8_ = (PyObject *)0x0;
            local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
            local_1a8._0_8_ = (function_record *)0x0;
            local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
            local_198 = (_Bit_pointer)0x0;
            if ((byte)local_17c != '\0') {
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_1b8,uVar19,false);
              puVar6 = local_128;
              hVar25.m_ptr = hStack_130.m_ptr;
              uVar4 = local_148.simple_value_holder[2];
              uVar3 = local_148.simple_value_holder[1];
              uVar2 = local_148.simple_value_holder[0];
              local_1c8 = local_128;
              local_1e8._16_8_ = local_148.simple_value_holder[2];
              oStack_1d0.super_handle.m_ptr = (handle)(handle)hStack_130.m_ptr;
              local_1e8._0_8_ = local_148.simple_value_holder[0];
              local_1e8._8_8_ = local_148.simple_value_holder[1];
              local_128 = local_198;
              local_148.simple_value_holder[2] = (void *)local_1a8._0_8_;
              hStack_130.m_ptr = (PyObject *)local_1a8._8_8_;
              local_148.simple_value_holder[0] = (void *)local_1b8._0_8_;
              local_148.simple_value_holder[1] = (void *)local_1b8._8_8_;
              local_1b8._0_8_ = uVar2;
              local_1b8._8_8_ = uVar3;
              local_1a8._0_8_ = uVar4;
              local_1a8._8_8_ = hVar25.m_ptr;
              local_198 = puVar6;
            }
            detail::loader_life_support::loader_life_support((loader_life_support *)local_1e8);
            hVar25.m_ptr = (PyObject *)(*(code *)hVar20.m_ptr[3].ob_refcnt)(local_168);
            detail::loader_life_support::~loader_life_support((loader_life_support *)local_1e8);
            puVar6 = local_128;
            hVar5.m_ptr = hStack_130.m_ptr;
            uVar4 = local_148.simple_value_holder[2];
            uVar3 = local_148.simple_value_holder[1];
            uVar2 = local_148.simple_value_holder[0];
            bVar26 = (value_and_holder *)hVar25.m_ptr != (value_and_holder *)0x1;
            if (((byte)local_17c & (value_and_holder *)hVar25.m_ptr == (value_and_holder *)0x1) != 0
               ) {
              bVar26 = false;
              for (uVar19 = (ulong)(*(byte *)((long)&hVar20.m_ptr[5].ob_type + 1) >> 6 & 1);
                  uVar19 < local_100; uVar19 = uVar19 + 1) {
                uVar23 = uVar19 + 0x3f;
                if (-1 < (long)uVar19) {
                  uVar23 = uVar19;
                }
                if ((*(ulong *)(local_1b8._0_8_ +
                               (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar23 >> 6) * 8 + -8) >> (uVar19 & 0x3f) & 1) != 0) {
                  local_1c8 = local_128;
                  local_1e8._16_8_ = local_148.simple_value_holder[2];
                  oStack_1d0.super_handle.m_ptr = (handle)(handle)hStack_130.m_ptr;
                  local_1e8._0_8_ = local_148.simple_value_holder[0];
                  local_1e8._8_8_ = local_148.simple_value_holder[1];
                  bVar26 = false;
                  local_128 = local_198;
                  local_148.simple_value_holder[2] = (void *)local_1a8._0_8_;
                  hStack_130.m_ptr = (PyObject *)local_1a8._8_8_;
                  local_148.simple_value_holder[0] = (void *)local_1b8._0_8_;
                  local_148.simple_value_holder[1] = (void *)local_1b8._8_8_;
                  local_1b8._0_8_ = uVar2;
                  local_1b8._8_8_ = uVar3;
                  local_1a8._0_8_ = uVar4;
                  local_1a8._8_8_ = hVar5.m_ptr;
                  local_198 = puVar6;
                  std::
                  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ::emplace_back<pybind11::detail::function_call>
                            ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              *)local_f8,(function_call *)local_168);
                  break;
                }
              }
            }
            if ((function_record *)local_1b8._0_8_ != (function_record *)0x0) {
              operator_delete((void *)local_1b8._0_8_,(long)local_198 - local_1b8._0_8_);
              local_1b8._0_8_ = (PyObject *)0x0;
              local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
              local_1a8._0_8_ = (function_record *)0x0;
              local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
              local_198 = (_Bit_pointer)0x0;
            }
          }
          else {
            bVar26 = false;
          }
LAB_0010e16e:
          object::~object((object *)&local_d0);
        }
        object::~object(&local_118);
        object::~object(&oStack_120);
        if ((function_record *)local_148.simple_value_holder[0] != (function_record *)0x0) {
          operator_delete(local_148.simple_value_holder[0],(long)local_128 - local_148._0_8_);
          local_148.simple_value_holder[0] = (function_record *)0x0;
          local_148.simple_value_holder[1] =
               (void *)((ulong)local_148.simple_value_holder[1] & 0xffffffff00000000);
          local_148.simple_value_holder[2] = (function_record *)0x0;
          hStack_130.m_ptr = hStack_130.m_ptr & 0xffffffff00000000;
          local_128 = (_Bit_pointer)0x0;
        }
        if ((PyTypeObject *)auStack_160._0_8_ != (PyTypeObject *)0x0) {
          operator_delete((void *)auStack_160._0_8_,(long)paStack_150 - auStack_160._0_8_);
        }
      }
    } while ((!bVar26) &&
            (hVar20.m_ptr = (PyObject *)hVar20.m_ptr[7].ob_type,
            (PyTypeObject *)hVar20.m_ptr != (PyTypeObject *)0x0));
  }
  uVar2 = local_f8._8_8_;
  pPVar24 = local_178;
  if (((byte)local_17c != '\0') &&
     ((local_f8._0_8_ != local_f8._8_8_ &&
      ((value_and_holder *)hVar25.m_ptr == (value_and_holder *)0x1)))) {
    pfVar21 = (function_record *)local_f8._0_8_;
    do {
      detail::loader_life_support::loader_life_support((loader_life_support *)local_168);
      hVar25 = (*((function_record *)pfVar21->name)->impl)((function_call *)pfVar21);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_168);
      if (hVar25.m_ptr != (PyObject *)0x1) break;
      pfVar21 = (function_record *)&pfVar21->scope;
    } while (pfVar21 != (function_record *)uVar2);
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_f8);
  if ((value_and_holder *)hVar25.m_ptr == (value_and_holder *)0x0) {
    local_168 = (undefined1  [8])(auStack_160 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_168);
    lVar13 = std::__cxx11::string::find(local_168,0x1331df,0);
    if (lVar13 != -1) {
      std::__cxx11::string::append(local_168);
    }
    PyErr_SetString(_PyExc_TypeError,local_168);
    if (local_168 == (undefined1  [8])(auStack_160 + 8)) {
      return (PyObject *)(value_and_holder *)0x0;
    }
    goto LAB_0010ec96;
  }
  if ((value_and_holder *)hVar25.m_ptr != (value_and_holder *)0x1) {
    if (((ulong)pPVar24->tp_repr & 0x100) == 0) {
      return hVar25.m_ptr;
    }
    if ((*(byte *)&local_78->tp_dealloc & 2) == 0) {
      bVar8 = local_78->tp_name[(long)&(pPStack_70->ob_base).ob_base];
    }
    else {
      bVar8 = *(byte *)&local_78->tp_dealloc >> 2;
    }
    if ((bVar8 & 1) == 0) {
      (*local_68->init_instance)((instance *)local_98,(void *)0x0);
      return hVar25.m_ptr;
    }
    return hVar25.m_ptr;
  }
  if (((ulong)pPVar24->tp_repr & 0x800) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)(value_and_holder *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string
            ((string *)local_f8,(char *)(pPVar24->ob_base).ob_base.ob_refcnt,(allocator *)&local_170
            );
  puVar11 = (undefined8 *)std::__cxx11::string::append(local_f8);
  pfVar21 = (function_record *)(puVar11 + 2);
  if ((function_record *)*puVar11 == pfVar21) {
    local_1a8._0_8_ = pfVar21->name;
    local_1a8._8_8_ = puVar11[3];
    local_1b8._0_8_ = (PyObject *)local_1a8;
  }
  else {
    local_1a8._0_8_ = pfVar21->name;
    local_1b8._0_8_ = (PyObject *)*puVar11;
  }
  local_1b8._8_8_ = puVar11[1];
  *puVar11 = pfVar21;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  bVar8 = *(byte *)((long)&pPVar24->tp_repr + 1);
  iVar10 = 0x132f2e;
  if ((bVar8 & 1) != 0) {
    iVar10 = 0x132f22;
  }
  local_d0.m_ptr = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,iVar10,iVar10 + (bVar8 & 1) * 3 + 8);
  pfVar21 = (function_record *)((long)(function_record **)local_1b8._8_8_ + local_c8);
  pfVar14 = (function_record *)0xf;
  if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
    pfVar14 = (function_record *)local_1a8._0_8_;
  }
  if (pfVar14 < pfVar21) {
    pfVar14 = (function_record *)0xf;
    if (local_d0.m_ptr != &local_c0) {
      pfVar14 = (function_record *)local_c0.ob_refcnt;
    }
    if (pfVar14 < pfVar21) goto LAB_0010e523;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,local_1b8._0_8_);
  }
  else {
LAB_0010e523:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_1b8,(ulong)local_d0.m_ptr);
  }
  local_1e8._0_8_ = local_1e8 + 0x10;
  pfVar21 = (function_record *)(puVar11 + 2);
  if ((function_record *)*puVar11 == pfVar21) {
    local_1e8._16_8_ = pfVar21->name;
    oStack_1d0.super_handle.m_ptr = (handle)puVar11[3];
  }
  else {
    local_1e8._16_8_ = pfVar21->name;
    local_1e8._0_8_ = (function_record *)*puVar11;
  }
  local_1e8._8_8_ = puVar11[1];
  *puVar11 = pfVar21;
  puVar11[1] = 0;
  *(undefined1 *)&pfVar21->name = 0;
  plVar12 = (long *)std::__cxx11::string::append(local_1e8);
  local_168 = (undefined1  [8])(auStack_160 + 8);
  piVar17 = (instance *)(plVar12 + 2);
  if ((instance *)*plVar12 == piVar17) {
    auStack_160._8_8_ = (piVar17->ob_base).ob_refcnt;
    paStack_150 = (pointer)plVar12[3];
  }
  else {
    auStack_160._8_8_ = (piVar17->ob_base).ob_refcnt;
    local_168 = (undefined1  [8])*plVar12;
  }
  auStack_160._0_8_ = plVar12[1];
  *plVar12 = (long)piVar17;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  if ((function_record *)local_1e8._0_8_ != (function_record *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  if (local_d0.m_ptr != &local_c0) {
    operator_delete(local_d0.m_ptr,(ulong)((long)(char **)local_c0.ob_refcnt + 1));
  }
  pPVar24 = local_178;
  if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
  }
  if ((function_record *)local_f8._0_8_ != (function_record *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,(ulong)((long)(function_record **)local_f8._16_8_ + 1));
  }
  uVar22 = 0;
  do {
    __val = uVar22 + 1;
    __len = 1;
    if (8 < uVar22) {
      uVar19 = (ulong)__val;
      uVar22 = 4;
      do {
        __len = uVar22;
        uVar9 = (uint)uVar19;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0010e6c7;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0010e6c7;
        }
        if (uVar9 < 10000) goto LAB_0010e6c7;
        uVar19 = uVar19 / 10000;
        uVar22 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0010e6c7:
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_f8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8._0_8_,__len,__val);
    puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x13227e);
    local_1b8._0_8_ = local_1a8;
    pfVar21 = (function_record *)(puVar11 + 2);
    if ((function_record *)*puVar11 == pfVar21) {
      local_1a8._0_8_ = pfVar21->name;
      local_1a8._8_8_ = puVar11[3];
    }
    else {
      local_1a8._0_8_ = pfVar21->name;
      local_1b8._0_8_ = (PyObject *)*puVar11;
    }
    local_1b8._8_8_ = puVar11[1];
    *puVar11 = pfVar21;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append(local_1b8);
    local_1e8._0_8_ = local_1e8 + 0x10;
    pfVar21 = (function_record *)(puVar11 + 2);
    if ((function_record *)*puVar11 == pfVar21) {
      local_1e8._16_8_ = pfVar21->name;
      oStack_1d0.super_handle.m_ptr = (handle)puVar11[3];
    }
    else {
      local_1e8._16_8_ = pfVar21->name;
      local_1e8._0_8_ = (function_record *)*puVar11;
    }
    local_1e8._8_8_ = puVar11[1];
    *puVar11 = pfVar21;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_168,local_1e8._0_8_);
    if ((function_record *)local_1e8._0_8_ != (function_record *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    if ((function_record *)local_1b8._0_8_ != (function_record *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
    }
    if ((function_record *)local_f8._0_8_ != (function_record *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,(ulong)((long)(function_record **)local_f8._16_8_ + 1))
      ;
    }
    if (((ulong)local_178->tp_repr & 0x100) == 0) {
LAB_0010e946:
      std::__cxx11::string::append((char *)local_168);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_1e8,(char *)(pPVar24->ob_base).ob_size,(allocator *)local_1b8);
      lVar13 = std::__cxx11::string::find((char)local_1e8,0x28);
      pfVar21 = (function_record *)(lVar13 + 7);
      if ((ulong)local_1e8._8_8_ <= pfVar21) {
LAB_0010e92b:
        if ((function_record *)local_1e8._0_8_ != (function_record *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
        }
        goto LAB_0010e946;
      }
      pfVar14 = (function_record *)std::__cxx11::string::find(local_1e8,0x134247,0);
      local_100 = std::__cxx11::string::rfind(local_1e8,0x132f70,0xffffffffffffffff);
      if (pfVar14 < (ulong)local_1e8._8_8_) {
        pfVar15 = (function_record *)((long)&pfVar14->name + 2);
      }
      else {
        pfVar15 = (function_record *)std::__cxx11::string::find((char)local_1e8,0x29);
        pfVar14 = pfVar15;
      }
      if ((pfVar14 <= pfVar21) || ((ulong)local_1e8._8_8_ <= pfVar15)) goto LAB_0010e92b;
      std::__cxx11::string::append((string *)local_168,(ulong)local_1e8,(ulong)pfVar21);
      std::__cxx11::string::push_back((char)(string *)local_168);
      std::__cxx11::string::append((string *)local_168,(ulong)local_1e8,(ulong)pfVar15);
      if ((function_record *)local_1e8._0_8_ != (function_record *)(local_1e8 + 0x10)) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_168);
    pPVar24 = (PyTypeObject *)pPVar24->tp_hash;
    uVar22 = __val;
  } while (pPVar24 != (PyTypeObject *)0x0);
  std::__cxx11::string::append(local_168);
  local_d0.m_ptr = (PyObject *)local_188;
  if (local_188 != (function_record *)0x0) {
    local_188->name = (char *)((long)&((function_record *)local_188->name)->name + 1);
  }
  bVar26 = false;
  for (pfVar21 = (function_record *)(ulong)(*(byte *)((long)&local_178->tp_repr + 1) & 1);
      pfVar14 = (function_record *)PyTuple_Size(local_d0.m_ptr), pfVar21 < pfVar14;
      pfVar21 = (function_record *)((long)&pfVar21->name + 1)) {
    bVar1 = true;
    if (bVar26) {
      std::__cxx11::string::append(local_168);
      bVar1 = bVar26;
    }
    bVar26 = bVar1;
    local_1b8._8_8_ = local_d0.m_ptr;
    local_1a8._8_8_ = (PyObject *)0x0;
    local_1a8._0_8_ = pfVar21;
    poVar16 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_1b8);
    local_170.m_ptr = (poVar16->super_handle).m_ptr;
    if ((function_record *)local_170.m_ptr != (function_record *)0x0) {
      ((function_record *)local_170.m_ptr)->name =
           (char *)((long)&((function_record *)((function_record *)local_170.m_ptr)->name)->name + 1
                   );
    }
    hVar25.m_ptr = (PyObject *)PyObject_Repr(local_170.m_ptr);
    if ((function_record *)hVar25.m_ptr == (function_record *)0x0) {
      this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_00);
      __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_f8._0_8_ = hVar25.m_ptr;
    str::operator_cast_to_string((string *)local_1e8,(str *)local_f8);
    std::__cxx11::string::_M_append(local_168,local_1e8._0_8_);
    if ((function_record *)local_1e8._0_8_ != (function_record *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    object::~object((object *)local_f8);
    object::~object((object *)&local_170);
    object::~object((object *)(local_1a8 + 8));
  }
  if (local_a8 != (function_record *)0x0) {
    local_170.m_ptr = (PyObject *)local_a8;
    local_a8->name = (char *)((long)&((function_record *)local_a8->name)->name + 1);
    lVar13 = PyDict_Size();
    if (lVar13 != 0) {
      if (bVar26) {
        std::__cxx11::string::append(local_168);
      }
      std::__cxx11::string::append(local_168);
      local_1e8._0_8_ = local_170.m_ptr;
      local_1e8._8_8_ = (function_record *)0x0;
      local_1e8._16_8_ = (function_record *)0x0;
      oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar10 = PyDict_Next();
      if (iVar10 == 0) {
        oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
      }
      if (oStack_1d0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff) {
        bVar26 = true;
        do {
          local_f8._0_8_ = local_1e8._8_8_;
          local_f8._8_8_ = local_1e8._16_8_;
          if (bVar26) {
            bVar26 = false;
          }
          else {
            std::__cxx11::string::append(local_168);
          }
          str::str((str *)&stack0xffffffffffffffc0,"{}={!r}");
          str::format<pybind11::handle&,pybind11::handle&>
                    ((str *)&stack0xffffffffffffffc8,(handle *)&stack0xffffffffffffffc0,
                     (handle *)local_f8);
          str::operator_cast_to_string((string *)local_1b8,(str *)&stack0xffffffffffffffc8);
          std::__cxx11::string::_M_append(local_168,local_1b8._0_8_);
          if ((function_record *)local_1b8._0_8_ != (function_record *)local_1a8) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
          }
          object::~object((object *)&stack0xffffffffffffffc8);
          object::~object((object *)&stack0xffffffffffffffc0);
          iVar10 = PyDict_Next(local_1e8._0_8_,local_1e8 + 0x18,local_1e8 + 8,local_1e8 + 0x10);
          if (iVar10 == 0) {
            oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
          }
        } while (oStack_1d0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff);
      }
    }
    object::~object((object *)&local_170);
  }
  lVar13 = std::__cxx11::string::find(local_168,0x1331df,0);
  if (lVar13 != -1) {
    std::__cxx11::string::append(local_168);
  }
  PyErr_SetString(_PyExc_TypeError,local_168);
  object::~object((object *)&local_d0);
  if (local_168 == (undefined1  [8])(auStack_160 + 8)) {
    return (PyObject *)(value_and_holder *)0x0;
  }
LAB_0010ec96:
  operator_delete((void *)local_168,(ulong)((long)(PyTypeObject **)auStack_160._8_8_ + 1));
  return (PyObject *)(value_and_holder *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, false);

            if (!self_value_and_holder.type || !self_value_and_holder.inst) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.push_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#if defined(__GNUG__) && !defined(__clang__)
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }